

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileUtilityTargetGenerator.cxx
# Opt level: O1

void __thiscall
cmMakefileUtilityTargetGenerator::~cmMakefileUtilityTargetGenerator
          (cmMakefileUtilityTargetGenerator *this)

{
  ~cmMakefileUtilityTargetGenerator(this);
  operator_delete(this,0x418);
  return;
}

Assistant:

cmMakefileUtilityTargetGenerator
::~cmMakefileUtilityTargetGenerator()
{
  delete this->OSXBundleGenerator;
}